

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupTestCase.cpp
# Opt level: O3

void __thiscall SuiteGroupTests::Testreplace::~Testreplace(Testreplace *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(replace)
{
  Group parent(5, 100);

  Group child(1, 10);
  child.setField(1, "1");
  child.setField(2, "2");
  parent.addGroup(child);

  Group replacementChild(1, 10);
  replacementChild.setField(1, "replace_1");
  replacementChild.setField(2, "replace_2");

  parent.replaceGroup(1, replacementChild);

  Group actualChild(1, 10);
  parent.getGroup(1, actualChild);

  CHECK_EQUAL("replace_1", actualChild.getField(1));
  CHECK_EQUAL("replace_2", actualChild.getField(2));

}